

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

uint __thiscall glslang::TType::getBufferReferenceAlignment(TType *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->_vptr_TType[7])();
  uVar2 = 0;
  if (iVar1 == 0x12) {
    iVar1 = (*this->_vptr_TType[0x15])(this);
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                      ((long *)CONCAT44(extraout_var,iVar1));
    uVar2 = 0x10;
    if ((~*(ulong *)(lVar3 + 0x24) & 0x1f8000000000000) != 0) {
      iVar1 = (*this->_vptr_TType[0x15])(this);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x50))
                        ((long *)CONCAT44(extraout_var_00,iVar1));
      uVar2 = 1 << ((byte)(*(ulong *)(lVar3 + 0x24) >> 0x33) & 0x1f);
    }
  }
  return uVar2;
}

Assistant:

unsigned int getBufferReferenceAlignment() const
    {
        if (getBasicType() == glslang::EbtReference) {
            return getReferentType()->getQualifier().hasBufferReferenceAlign() ?
                        (1u << getReferentType()->getQualifier().layoutBufferReferenceAlign) : 16u;
        }
        return 0;
    }